

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O1

void h264_print_ref_pic_list_modification(h264_ref_pic_list_modification *list,char *which)

{
  uint uVar1;
  h264_slice_ref_pic_list_modification_entry *phVar2;
  
  printf("\tref_pic_list_modification_flag_%s = %d\n",which,(ulong)list->flag);
  uVar1 = list->list[0].op;
  if (uVar1 != 3) {
    phVar2 = list->list;
    do {
      phVar2 = phVar2 + 1;
      printf("\tmodification_of_pic_nums_idc = %d [%s]\n",(ulong)uVar1,
             h264_print_ref_pic_list_modification_opnames_rel +
             *(int *)(h264_print_ref_pic_list_modification_opnames_rel + (long)(int)uVar1 * 4));
      printf("\t%s = %d\n",h264_print_ref_pic_list_modification::argnames[(int)uVar1],
             (ulong)phVar2[-1].param);
      uVar1 = phVar2->op;
    } while (uVar1 != 3);
  }
  puts("\tmodification_of_pic_nums_idc = 3 [END]");
  return;
}

Assistant:

void h264_print_ref_pic_list_modification(struct h264_ref_pic_list_modification *list, char *which) {
	static const char *const opnames[6] = { "pic_num sub", "pic_num add", "long term", "end", "view idx sub", "view idx add" };
	static const char *const argnames[6] = { "abs_diff_pic_num_minus1", "abs_diff_pic_num_minus1", "long_term_pic_num", 0, "abs_diff_view_idx_minus1", "abs_diff_view_idx_minus1" };
	int i;
	printf("\tref_pic_list_modification_flag_%s = %d\n", which, list->flag);
	for (i = 0; list->list[i].op != 3; i++) {
		int op = list->list[i].op;
		printf("\tmodification_of_pic_nums_idc = %d [%s]\n", op, opnames[op]);
		printf("\t%s = %d\n", argnames[op], list->list[i].param);
	}
	printf("\tmodification_of_pic_nums_idc = 3 [END]\n");
}